

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midithru.c
# Opt level: O2

void process_midi(PtTimestamp timestamp,void *userData)

{
  int iVar1;
  PmError PVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  PmEvent buffer;
  
  current_timestamp = current_timestamp + 1;
  if (active == 0) {
    process_midi_exit_flag = 1;
  }
  else {
    if (app_sysex_in_progress == 0) {
LAB_001026fd:
      PVar2 = Pm_Poll(midi_in);
      if (PVar2 != pmNoData) {
        iVar1 = Pm_Read(midi_in,&buffer,1);
        if (iVar1 != -0x270c) {
          if (iVar1 != 1) {
            __assert_fail("rslt == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_test/midithru.c"
                          ,0x8b,"void process_midi(PtTimestamp, void *)");
          }
          last_timestamp = current_timestamp;
          if ((buffer.message & 0x80U) != 0 || thru_sysex_in_progress != 0) {
            uVar5 = buffer.message & 0xff;
            Pm_Write(midi_out,&buffer,1);
            PVar2 = Pm_Enqueue(in_queue,&buffer);
            if (uVar5 == 0xf0) {
              thru_sysex_in_progress = 1;
LAB_001027a0:
              auVar7._0_4_ = -(uint)((buffer.message & 0xffU) == 0xf7);
              auVar7._4_4_ = -(uint)((buffer.message & 0xff00U) == 0xf700);
              auVar7._8_4_ = -(uint)((buffer.message & 0xff0000U) == 0xf70000);
              auVar7._12_4_ = -(uint)((buffer.message & 0xff000000U) == 0xf7000000);
              iVar1 = movmskps(PVar2,auVar7);
              if (iVar1 == 0) goto LAB_001026fd;
            }
            else if ((~uVar5 & 0xf8) == 0) {
              if (thru_sysex_in_progress != 0) goto LAB_001027a0;
              goto LAB_001026fd;
            }
            thru_sysex_in_progress = 0;
          }
        }
        goto LAB_001026fd;
      }
    }
LAB_001025fb:
    iVar1 = Pm_QueueEmpty(out_queue);
    if (iVar1 == 0) {
      puVar3 = (uint *)Pm_QueuePeek(out_queue);
      if (puVar3 == (uint *)0x0) {
        __assert_fail("next",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jwinarske[P]portmidi/pm_test/midithru.c"
                      ,0xbd,"void process_midi(PtTimestamp, void *)");
      }
      if (current_timestamp < (int)puVar3[1]) {
        return;
      }
      uVar5 = *puVar3;
      uVar4 = uVar5 & 0xf8;
      if ((uVar4 != 0xf8) && (thru_sysex_in_progress != 0)) {
        if (current_timestamp <= last_timestamp + 5000) {
          return;
        }
        thru_sysex_in_progress = 0;
      }
      Pm_Dequeue(out_queue,&buffer);
      PVar2 = Pm_Write(midi_out,&buffer,1);
      if ((uVar5 & 0xff) == 0xf0) {
        app_sysex_in_progress = 1;
        goto LAB_001026b7;
      }
      if (uVar4 == 0xf8) goto code_r0x001026aa;
      goto LAB_001026d8;
    }
  }
  return;
code_r0x001026aa:
  if (app_sysex_in_progress != 0) {
LAB_001026b7:
    auVar6._0_4_ = -(uint)((buffer.message & 0xffU) == 0xf7);
    auVar6._4_4_ = -(uint)((buffer.message & 0xff00U) == 0xf700);
    auVar6._8_4_ = -(uint)((buffer.message & 0xff0000U) == 0xf70000);
    auVar6._12_4_ = -(uint)((buffer.message & 0xff000000U) == 0xf7000000);
    iVar1 = movmskps(PVar2,auVar6);
    if (iVar1 != 0) {
LAB_001026d8:
      app_sysex_in_progress = 0;
    }
  }
  goto LAB_001025fb;
}

Assistant:

void process_midi(PtTimestamp timestamp, void *userData)
{
    PmError result;
    PmEvent buffer; /* just one message at a time */

    current_timestamp++; /* update every millisecond */
    /* if (current_timestamp % 1000 == 0) 
        printf("time %d\n", current_timestamp); */

    /* do nothing until initialization completes */
    if (!active) {
        /* this flag signals that no more midi processing will be done */
        process_midi_exit_flag = TRUE;
        return;
    }

    /* see if there is any midi input to process */
    if (!app_sysex_in_progress) {
        do {
            result = Pm_Poll(midi_in);
            if (result) {
                int status;
                PmError rslt = Pm_Read(midi_in, &buffer, 1);
                if (rslt == pmBufferOverflow) 
                    continue;
                assert(rslt == 1);

                /* record timestamp of most recent data */
                last_timestamp = current_timestamp;

                /* the data might be the end of a sysex message that
                   has timed out, in which case we must ignore it.
                   It's a continuation of a sysex message if status
                   is actually a data byte (high-order bit is zero). */
                status = Pm_MessageStatus(buffer.message);
                if (((status & 0x80) == 0) && !thru_sysex_in_progress) {
                    continue; /* ignore this data */
                }

                /* implement midi thru */
                /* note that you could output to multiple ports or do other
                   processing here if you wanted
                 */
                /* printf("thru: %x\n", buffer.message); */
                Pm_Write(midi_out, &buffer, 1);

                /* send the message to the application */
                /* you might want to filter clock or active sense messages here
                   to avoid sending a bunch of junk to the application even if
                   you want to send it to MIDI THRU
                 */
                Pm_Enqueue(in_queue, &buffer);

                /* sysex processing */
                if (status == MIDI_SYSEX) thru_sysex_in_progress = TRUE;
                else if ((status & 0xF8) != 0xF8) {
                    /* not MIDI_SYSEX and not real-time, so */
                    thru_sysex_in_progress = FALSE;
                }
                if (thru_sysex_in_progress && /* look for EOX */
                    (((buffer.message & 0xFF) == MIDI_EOX) ||
                     (((buffer.message >> 8) & 0xFF) == MIDI_EOX) ||
                     (((buffer.message >> 16) & 0xFF) == MIDI_EOX) ||
                     (((buffer.message >> 24) & 0xFF) == MIDI_EOX))) {
                    thru_sysex_in_progress = FALSE;
                }
            }
        } while (result);
    }


    /* see if there is application midi data to process */
    while (!Pm_QueueEmpty(out_queue)) {
        /* see if it is time to output the next message */
        PmEvent *next = (PmEvent *) Pm_QueuePeek(out_queue);
        assert(next); /* must be non-null because queue is not empty */
        if (next->timestamp <= current_timestamp) {
            /* time to send a message, first make sure it's not blocked */
            int status = Pm_MessageStatus(next->message);
            if ((status & 0xF8) == 0xF8) {
                ; /* real-time messages are not blocked */
            } else if (thru_sysex_in_progress) {
                /* maybe sysex has timed out (output becomes unblocked) */
                if (last_timestamp + 5000 < current_timestamp) {
                    thru_sysex_in_progress = FALSE;
                } else break; /* output is blocked, so exit loop */
            }
            Pm_Dequeue(out_queue, &buffer);
            Pm_Write(midi_out, &buffer, 1);

            /* inspect message to update app_sysex_in_progress */
            if (status == MIDI_SYSEX) app_sysex_in_progress = TRUE;
            else if ((status & 0xF8) != 0xF8) {
                /* not MIDI_SYSEX and not real-time, so */
                app_sysex_in_progress = FALSE;
            }
            if (app_sysex_in_progress && /* look for EOX */
                (((buffer.message & 0xFF) == MIDI_EOX) ||
                 (((buffer.message >> 8) & 0xFF) == MIDI_EOX) ||
                 (((buffer.message >> 16) & 0xFF) == MIDI_EOX) ||
                 (((buffer.message >> 24) & 0xFF) == MIDI_EOX))) {
                app_sysex_in_progress = FALSE;
            }
        } else break; /* wait until indicated timestamp */
    }
}